

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O2

idx_t duckdb::TemplatedSelectOperation<duckdb::GreaterThan>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  optional_ptr<duckdb::SelectionVector,_true> target;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  ValidityMask *pVVar2;
  SelectionVector *sel_00;
  idx_t iVar3;
  InternalException *this;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_local;
  optional_ptr<const_duckdb::SelectionVector,_true> local_1a0;
  optional_ptr<duckdb::SelectionVector,_true> local_198;
  optional_ptr<duckdb::ValidityMask,_true> local_190;
  SelectionVector maybe_vec;
  SelectionVector false_vec;
  SelectionVector true_vec;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  Vector l_not_null;
  Vector local_98;
  
  null_mask_local = null_mask;
  if (null_mask.ptr != (ValidityMask *)0x0) {
    pVVar2 = optional_ptr<duckdb::ValidityMask,_true>::operator*(&null_mask_local);
    UpdateNullMask(left,sel,count,pVVar2);
    pVVar2 = optional_ptr<duckdb::ValidityMask,_true>::operator*(&null_mask_local);
    UpdateNullMask(right,sel,count,pVVar2);
  }
  PVar1 = (left->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    iVar3 = BinaryExecutor::Select<signed_char,signed_char,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case UINT8:
    iVar3 = BinaryExecutor::Select<unsigned_char,unsigned_char,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case UINT16:
    iVar3 = BinaryExecutor::Select<unsigned_short,unsigned_short,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case INT16:
    iVar3 = BinaryExecutor::Select<short,short,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case UINT32:
    iVar3 = BinaryExecutor::Select<unsigned_int,unsigned_int,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case INT32:
    iVar3 = BinaryExecutor::Select<int,int,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case UINT64:
    iVar3 = BinaryExecutor::Select<unsigned_long,unsigned_long,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case INT64:
    iVar3 = BinaryExecutor::Select<long,long,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_013874ce_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&l_not_null,"Invalid type for comparison",(allocator *)&local_98);
    InternalException::InternalException(this,(string *)&l_not_null);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    iVar3 = BinaryExecutor::Select<float,float,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case DOUBLE:
    iVar3 = BinaryExecutor::Select<double,double,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case INTERVAL:
    iVar3 = BinaryExecutor::Select<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan>
                      (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    break;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_190.ptr = null_mask_local.ptr;
    local_1a0.ptr = sel.ptr;
    local_198.ptr = false_sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_1a0.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&true_vec,count);
    OptionalSelection::OptionalSelection(&true_opt,&true_vec);
    SelectionVector::SelectionVector(&false_vec,count);
    null_mask_00.ptr = local_190.ptr;
    OptionalSelection::OptionalSelection(&false_opt,&false_vec);
    target.ptr = local_198.ptr;
    SelectionVector::SelectionVector(&maybe_vec,count);
    Vector::Vector(&l_not_null,left);
    Vector::Vector(&local_98,right);
    sel_00 = optional_ptr<const_duckdb::SelectionVector,_true>::operator*(&local_1a0);
    iVar3 = SelectNotNull(&l_not_null,&local_98,count,sel_00,&maybe_vec,&false_opt,null_mask_00);
    iVar3 = VectorOperations::DistinctGreaterThan
                      (&l_not_null,&local_98,&maybe_vec,iVar3,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_opt.sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_opt.sel,null_mask_00);
    ScatterSelection(true_sel,iVar3,&true_vec);
    ScatterSelection(target,count - iVar3,&false_vec);
    Vector::~Vector(&local_98);
    Vector::~Vector(&l_not_null);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maybe_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&true_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&true_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    break;
  default:
    if (PVar1 == VARCHAR) {
      iVar3 = BinaryExecutor::Select<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    }
    else if (PVar1 == UINT128) {
      iVar3 = BinaryExecutor::Select<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    }
    else {
      if (PVar1 != INT128) goto switchD_013874ce_caseD_a;
      iVar3 = BinaryExecutor::Select<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan>
                        (left,right,sel.ptr,count,true_sel.ptr,false_sel.ptr);
    }
  }
  return iVar3;
}

Assistant:

static idx_t TemplatedSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel, idx_t count,
                                      optional_ptr<SelectionVector> true_sel, optional_ptr<SelectionVector> false_sel,
                                      optional_ptr<ValidityMask> null_mask) {
	if (null_mask) {
		UpdateNullMask(left, sel, count, *null_mask);
		UpdateNullMask(right, sel, count, *null_mask);
	}
	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return BinaryExecutor::Select<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get());
	case PhysicalType::INT16:
		return BinaryExecutor::Select<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::INT32:
		return BinaryExecutor::Select<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::INT64:
		return BinaryExecutor::Select<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::UINT8:
		return BinaryExecutor::Select<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                    false_sel.get());
	case PhysicalType::UINT16:
		return BinaryExecutor::Select<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::UINT32:
		return BinaryExecutor::Select<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::UINT64:
		return BinaryExecutor::Select<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::INT128:
		return BinaryExecutor::Select<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                        false_sel.get());
	case PhysicalType::UINT128:
		return BinaryExecutor::Select<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                          false_sel.get());
	case PhysicalType::FLOAT:
		return BinaryExecutor::Select<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get());
	case PhysicalType::DOUBLE:
		return BinaryExecutor::Select<double, double, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get());
	case PhysicalType::INTERVAL:
		return BinaryExecutor::Select<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                          false_sel.get());
	case PhysicalType::VARCHAR:
		return BinaryExecutor::Select<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                      false_sel.get());
	case PhysicalType::LIST:
	case PhysicalType::STRUCT:
	case PhysicalType::ARRAY:
		return NestedSelectOperation<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for comparison");
	}
}